

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void setvar(char *name,int i,bool dofunc,bool doclamp)

{
  ident *piVar1;
  uint uVar2;
  int iVar3;
  char *local_20;
  
  local_20 = name;
  piVar1 = hashset<ident>::access<char_const*>(&idents,&local_20);
  if (piVar1 == (ident *)0x0) {
    return;
  }
  if (piVar1->type != 0) {
    return;
  }
  uVar2 = piVar1->flags;
  if ((uVar2 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar2 & 0x10) == 0) goto LAB_0012735a;
    uVar2 = uVar2 & 0xffffffed;
  }
  else {
    if ((uVar2 & 1) != 0) {
      debugcode("cannot override persistent variable %s",piVar1->name);
      return;
    }
    if ((uVar2 & 0x10) != 0) goto LAB_0012735a;
    (piVar1->field_5).argmask = *(uint *)(piVar1->field_4).args;
    uVar2 = uVar2 | 0x10;
  }
  piVar1->flags = uVar2;
LAB_0012735a:
  if (doclamp) {
    iVar3 = (piVar1->field_3).maxval;
    if (i < (piVar1->field_3).maxval) {
      iVar3 = i;
    }
    i = iVar3;
    if (iVar3 < (piVar1->field_2).minval) {
      i = (piVar1->field_2).minval;
    }
  }
  *(int *)(piVar1->field_4).args = i;
  if ((dofunc) && (piVar1->fun != (identfun)0x0)) {
    (*piVar1->fun)();
  }
  return;
}

Assistant:

void setvar(const char *name, int i, bool dofunc, bool doclamp)
{
    GETVAR(id, name, );
    OVERRIDEVAR(return, id->overrideval.i = *id->storage.i, , )
    if(doclamp) *id->storage.i = clamp(i, id->minval, id->maxval);
    else *id->storage.i = i;
    if(dofunc) id->changed();
}